

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O1

void __thiscall Storage::Tape::TZX::get_generalised_data_block(TZX *this)

{
  FileHolder *this_00;
  uint8_t max_pulses_per_symbol;
  uint8_t number_of_symbols;
  uint8_t max_pulses_per_symbol_00;
  uint8_t number_of_symbols_00;
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t output_symbols;
  uint32_t output_symbols_00;
  long lVar3;
  
  this_00 = &this->file_;
  uVar2 = FileHolder::get32le(this_00);
  lVar3 = FileHolder::tell(this_00);
  uVar1 = FileHolder::get16le(this_00);
  output_symbols = FileHolder::get32le(this_00);
  max_pulses_per_symbol = FileHolder::get8(this_00);
  number_of_symbols = FileHolder::get8(this_00);
  output_symbols_00 = FileHolder::get32le(this_00);
  max_pulses_per_symbol_00 = FileHolder::get8(this_00);
  number_of_symbols_00 = FileHolder::get8(this_00);
  get_generalised_segment(this,output_symbols,max_pulses_per_symbol,number_of_symbols,false);
  get_generalised_segment(this,output_symbols_00,max_pulses_per_symbol_00,number_of_symbols_00,true)
  ;
  post_gap(this,(uint)uVar1);
  FileHolder::seek(this_00,(ulong)uVar2 + lVar3,0);
  return;
}

Assistant:

void TZX::get_generalised_data_block() {
	uint32_t block_length = file_.get32le();
	long endpoint = file_.tell() + long(block_length);
	uint16_t pause_after_block = file_.get16le();

	uint32_t total_pilot_symbols = file_.get32le();
	uint8_t maximum_pulses_per_pilot_symbol = file_.get8();
	uint8_t symbols_in_pilot_table = file_.get8();

	uint32_t total_data_symbols = file_.get32le();
	uint8_t maximum_pulses_per_data_symbol = file_.get8();
	uint8_t symbols_in_data_table = file_.get8();

	get_generalised_segment(total_pilot_symbols, maximum_pulses_per_pilot_symbol, symbols_in_pilot_table, false);
	get_generalised_segment(total_data_symbols, maximum_pulses_per_data_symbol, symbols_in_data_table, true);
	post_gap(pause_after_block);

	// This should be unnecessary, but intends to preserve sanity.
	file_.seek(endpoint, SEEK_SET);
}